

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D<vector_malloc_counter_clear<unsigned_char*,16u>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,
               vector_malloc_counter_clear<unsigned_char_*,_16U> *buckets)

{
  vector_malloc_counter_clear<unsigned_char_*,_16U> *pvVar1;
  ushort uVar2;
  uchar *puVar3;
  uchar *puVar4;
  size_t sVar5;
  int iVar6;
  uint j;
  long lVar7;
  size_t *psVar8;
  uchar **ppuVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  uint j_1;
  ulong n_00;
  uint i;
  long lVar13;
  uchar **ppuVar14;
  array<unsigned_short,_256UL> bucketsize;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < (long)n) {
      ppuVar9 = strings;
      do {
        iVar6 = (int)n;
        n = (size_t)(iVar6 - 1);
        puVar3 = ppuVar9[1];
        ppuVar9 = ppuVar9 + 1;
        for (ppuVar14 = ppuVar9; strings < ppuVar14; ppuVar14 = ppuVar14 + -1) {
          puVar4 = ppuVar14[-1];
          bVar11 = puVar4[depth];
          bVar12 = puVar3[depth];
          if ((bVar11 != 0) && (lVar7 = depth + 1, bVar11 == bVar12)) {
            do {
              bVar11 = puVar4[lVar7];
              bVar12 = puVar3[lVar7];
              if (bVar11 == 0) break;
              lVar7 = lVar7 + 1;
            } while (bVar11 == bVar12);
          }
          if (bVar11 <= bVar12) break;
          *ppuVar14 = puVar4;
        }
        *ppuVar14 = puVar3;
      } while (2 < iVar6);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      ppuVar9 = strings;
      do {
        lVar7 = 0;
        do {
          *(uchar *)((long)local_238 + lVar7) = ppuVar9[lVar7][depth];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        lVar7 = 0;
        do {
          pvVar1 = buckets + *(byte *)((long)local_238 + lVar7);
          if (pvVar1->_size == pvVar1->_capacity) {
            vector_malloc_counter_clear<unsigned_char_*,_16U>::grow(pvVar1);
          }
          sVar5 = pvVar1->_size;
          pvVar1->_data[sVar5] = ppuVar9[lVar7];
          pvVar1->_size = sVar5 + 1;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        uVar10 = uVar10 + 0x20;
        ppuVar9 = ppuVar9 + 0x20;
      } while (uVar10 < (n & 0xffffffffffffffe0));
    }
    if (uVar10 < n) {
      do {
        pvVar1 = buckets + strings[uVar10][depth];
        if (pvVar1->_size == pvVar1->_capacity) {
          vector_malloc_counter_clear<unsigned_char_*,_16U>::grow(pvVar1);
        }
        sVar5 = pvVar1->_size;
        pvVar1->_data[sVar5] = strings[uVar10];
        pvVar1->_size = sVar5 + 1;
        uVar10 = uVar10 + 1;
      } while (n != uVar10);
    }
    psVar8 = &buckets->_size;
    lVar7 = 0;
    do {
      local_238[lVar7] = (ushort)*psVar8;
      lVar7 = lVar7 + 1;
      psVar8 = psVar8 + 3;
    } while (lVar7 != 0x100);
    psVar8 = &buckets->_size;
    lVar7 = 0;
    lVar13 = 0;
    do {
      uVar2 = local_238[lVar7];
      if ((ulong)uVar2 != 0) {
        if (*psVar8 != 0) {
          memmove(strings + lVar13,
                  ((vector_malloc_counter_clear<unsigned_char_*,_16U> *)(psVar8 + -1))->_data,
                  *psVar8 << 3);
        }
        lVar13 = lVar13 + (ulong)uVar2;
      }
      lVar7 = lVar7 + 1;
      psVar8 = psVar8 + 3;
    } while (lVar7 != 0x100);
    lVar7 = 8;
    do {
      *(undefined8 *)((long)&buckets->_data + lVar7) = 0;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x1808);
    uVar10 = (ulong)local_238[0];
    lVar7 = 1;
    do {
      n_00 = (ulong)local_238[lVar7];
      if (n_00 != 0) {
        msd_D<vector_malloc_counter_clear<unsigned_char*,16u>,unsigned_short>
                  (strings + uVar10,n_00,depth + 1,buckets);
        uVar10 = uVar10 + n_00;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}